

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

Employee * __thiscall Company::maxEfficiency(Company *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int local_1c;
  Employee *pEStack_18;
  int i;
  Employee *max;
  Company *this_local;
  
  pEStack_18 = *this->employees;
  local_1c = 1;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(this->boss);
    if (iVar1 <= local_1c) break;
    dVar2 = Employee::efficiency(this->employees[local_1c]);
    dVar3 = Employee::efficiency(pEStack_18);
    if (dVar3 < dVar2) {
      pEStack_18 = this->employees[local_1c];
    }
    local_1c = local_1c + 1;
  }
  return pEStack_18;
}

Assistant:

Employee *Company::maxEfficiency() const {
    // return a pointer to the employee with maximum efficiency
    Employee *max = employees[0];
    for (int i = 1; i < boss->getNumberOfEmployees(); ++i) {
        if (employees[i]->efficiency() > max->efficiency())
            max = employees[i];
    }
    return max;
}